

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRandom.cpp
# Opt level: O2

Index __thiscall AgentRandom::Act(AgentRandom *this)

{
  _func_int *p_Var1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  Index IVar5;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrAis;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  undefined1 auVar7 [64];
  
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
        (**(code **)(**(long **)(*(long *)(&(this->super_AgentFullyObservable).field_0x10 +
                                          (long)(this->super_AgentFullyObservable).
                                                _vptr_AgentFullyObservable[-3]) + 0x30) + 0x58))();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28,__x);
  p_Var1 = (this->super_AgentFullyObservable)._vptr_AgentFullyObservable[-3];
  uVar3 = (**(code **)(*(long *)((long)&(this->super_AgentFullyObservable).
                                        _vptr_AgentFullyObservable + (long)p_Var1) + 0x10))
                    ((_func_int *)
                     ((long)&(this->super_AgentFullyObservable)._vptr_AgentFullyObservable +
                     (long)p_Var1));
  auVar7._8_56_ = extraout_var;
  auVar7._0_8_ = extraout_XMM0_Qa;
  auVar2 = vcvtusi2sd_avx512f(auVar7._0_16_,local_28._M_impl.super__Vector_impl_data._M_start[uVar3]
                             );
  iVar4 = rand();
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (double)iVar4 * 4.656612873077393e-10 * auVar2._0_8_;
  IVar5 = vcvttsd2usi_avx512f(auVar6);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  return IVar5;
}

Assistant:

Index AgentRandom::Act()
{
    vector<size_t> nrAis=GetPU()->GetNrActions();
    Index aI=static_cast<Index>(nrAis[GetIndex()]*
                                  (rand() / (RAND_MAX + 1.0)));
    return(aI);
}